

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::ScopeRandomizeFunction::~ScopeRandomizeFunction(ScopeRandomizeFunction *this)

{
  SystemSubroutine::~SystemSubroutine(&this->super_SystemSubroutine);
  operator_delete(this,0x38);
  return;
}

Assistant:

ScopeRandomizeFunction() :
        SystemSubroutine(KnownSystemName::Randomize, SubroutineKind::Function) {
        withClauseMode = WithClauseMode::Randomize;
    }